

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedFloats::SerializeWithCachedSizes
          (TensorValue_RepeatedFloats *this,CodedOutputStream *output)

{
  int iVar1;
  RepeatedField<float> *this_00;
  float *a;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  TensorValue_RepeatedFloats *this_local;
  
  iVar1 = values_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_values_cached_byte_size_);
    this_00 = values(this);
    a = google::protobuf::RepeatedField<float>::data(this_00);
    iVar1 = values_size(this);
    google::protobuf::internal::WireFormatLite::WriteFloatArray(a,iVar1,output);
  }
  return;
}

Assistant:

void TensorValue_RepeatedFloats::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.TensorValue.RepeatedFloats)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float values = 1 [packed = true];
  if (this->values_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_values_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->values().data(), this->values_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.TensorValue.RepeatedFloats)
}